

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.h
# Opt level: O2

void emitter_json_kv(emitter_t *emitter,char *json_key,emitter_type_t value_type,void *value)

{
  emitter_json_key(emitter,json_key);
  emitter_json_value(emitter,value_type,value);
  return;
}

Assistant:

static inline void
emitter_json_kv(emitter_t *emitter, const char *json_key,
    emitter_type_t value_type, const void *value) {
	emitter_json_key(emitter, json_key);
	emitter_json_value(emitter, value_type, value);
}